

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

void wasm::LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
     ::doVisitLocalGet(RelevantLiveLocalsWalker *self,Expression **currp)

{
  bool bVar1;
  Module *wasm;
  optional<wasm::Type> type;
  What local_5c;
  optional<wasm::Type> local_58;
  Expression *local_48;
  initializer_list<wasm::Expression_*> local_40;
  Block *local_30;
  Expression *rep;
  Builder builder;
  LocalGet *curr;
  Expression **currp_local;
  RelevantLiveLocalsWalker *self_local;
  
  curr = (LocalGet *)currp;
  currp_local = (Expression **)self;
  builder.wasm = (Module *)Expression::cast<wasm::LocalGet>(*currp);
  if (currp_local[0x23] == (Expression *)0x0) {
    wasm = Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::
           getModule((Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      *)currp_local);
    Builder::Builder((Builder *)&rep,wasm);
    local_30 = (Block *)Builder::replaceWithIdenticalType<wasm::LocalGet>
                                  ((Builder *)&rep,(LocalGet *)builder.wasm);
    bVar1 = Expression::is<wasm::LocalGet>((Expression *)local_30);
    if (bVar1) {
      local_48 = (Expression *)Builder::makeUnreachable((Builder *)&rep);
      local_40._M_array = &local_48;
      local_40._M_len = 1;
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                (&local_58,
                 (Type *)&((builder.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      local_30 = Builder::makeBlock((Builder *)&rep,&local_40,type);
    }
    *(Block **)&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression =
         local_30;
  }
  else {
    local_5c = Get;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               (currp_local[0x23] + 3),&local_5c,
               (uint *)&((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression ***)&curr);
  }
  return;
}

Assistant:

static void doVisitLocalGet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalGet>();
    // if in unreachable code, ignore
    if (!self->currBasicBlock) {
      Builder builder(*self->getModule());
      auto* rep = builder.replaceWithIdenticalType(curr);
      if (rep->is<LocalGet>()) {
        // We failed to replace the node with something simpler. This can happen
        // if the local is non-nullable, for example. We still need to remove
        // this node entirely, however, as it is unreachable and so we will not
        // see it in the analysis we perform (for example, we may be changing
        // local indexes). Replace it with something completely different, even
        // if it is larger, a block with a forced type that has unreachable
        // contents,
        //
        //  (block (result X)
        //   (unreachable))
        //
        // That pattern lets us set any type we wish.
        //
        // TODO: Make a helper function for this, if it is useful in other
        //       places.
        rep = builder.makeBlock({builder.makeUnreachable()}, curr->type);
      }
      *currp = rep;
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Get, curr->index, currp);
  }